

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O2

int InsertionSort(EdgeTableEntry *AET)

{
  _EdgeTableEntry *p_Var1;
  _EdgeTableEntry *p_Var2;
  _EdgeTableEntry *p_Var3;
  int iVar4;
  _EdgeTableEntry *p_Var5;
  _EdgeTableEntry *p_Var6;
  _EdgeTableEntry *p_Var7;
  
  iVar4 = 0;
  p_Var2 = AET->next;
  while (p_Var6 = p_Var2, p_Var6 != (_EdgeTableEntry *)0x0) {
    p_Var1 = p_Var6;
    do {
      p_Var7 = p_Var1;
      p_Var1 = p_Var7->back;
    } while ((p_Var6->bres).minor_axis < (p_Var1->bres).minor_axis);
    p_Var2 = p_Var6->next;
    if (p_Var7 != p_Var6) {
      p_Var3 = p_Var6->back;
      p_Var3->next = p_Var2;
      p_Var5 = p_Var1;
      if (p_Var2 != (_EdgeTableEntry *)0x0) {
        p_Var2->back = p_Var3;
        p_Var5 = p_Var7->back;
      }
      p_Var6->next = p_Var7;
      p_Var5->next = p_Var6;
      p_Var7->back = p_Var6;
      p_Var6->back = p_Var1;
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

static int InsertionSort(EdgeTableEntry *AET)
{
    EdgeTableEntry *pETEchase;
    EdgeTableEntry *pETEinsert;
    EdgeTableEntry *pETEchaseBackTMP;
    int changed = 0;

    AET = AET->next;
    while (AET) {
        pETEinsert = AET;
        pETEchase = AET;
        while (pETEchase->back->bres.minor_axis > AET->bres.minor_axis)
            pETEchase = pETEchase->back;

        AET = AET->next;
        if (pETEchase != pETEinsert) {
            pETEchaseBackTMP = pETEchase->back;
            pETEinsert->back->next = AET;
            if (AET)
                AET->back = pETEinsert->back;
            pETEinsert->next = pETEchase;
            pETEchase->back->next = pETEinsert;
            pETEchase->back = pETEinsert;
            pETEinsert->back = pETEchaseBackTMP;
            changed = 1;
        }
    }
    return changed;
}